

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  long *plVar2;
  long *plVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  long *plVar5;
  long lVar6;
  string source;
  string invalid_uniform_block_shader_source;
  string invalid_buffer_shader_source;
  string input_block_shader_source [3];
  string invalid_input_shader_source [5];
  string invalid_output_shader_source [6];
  string output_block_shader_source [6];
  undefined1 *local_320;
  undefined8 local_318;
  undefined1 local_310;
  undefined7 uStack_30f;
  InteractionInterfaceArrays<glcts::ArraysOfArrays::Interface::ES> *local_300;
  long *local_2f8;
  long local_2f0;
  long local_2e8 [2];
  long *local_2d8;
  long local_2d0;
  long local_2c8 [2];
  undefined1 *local_2b8 [2];
  undefined1 local_2a8 [16];
  undefined1 *local_298 [2];
  undefined1 local_288 [16];
  long *local_278 [2];
  long local_268 [2];
  undefined1 *local_258 [2];
  undefined1 local_248 [16];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  long *local_1d8 [2];
  long local_1c8 [2];
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178 [2];
  undefined1 local_168 [16];
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  long *local_118 [2];
  long local_108 [2];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_2d8 = local_2c8;
  local_300 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d8,
             "layout(std140) buffer MyBuffer\n{\n    float f;\n    int   i;\n    uint  ui;\n} myBuffers[2][2];\n\nvoid main()\n{\n"
             ,"");
  local_258[0] = local_248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"in  float input_variable","")
  ;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"[2][2];\nout float output_variable","");
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,";\n\nvoid main()\n{\n    output_variable","");
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8," = input_variable","");
  plVar3 = local_1c8;
  local_1d8[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"[0][0];\n","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"out float output_variable","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,"[2][2];\n\nvoid main()\n{\n    output_variable","");
  local_178[0] = local_168;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"[0][0] = 0.0;\n    output_variable","");
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_158,"[0][1] = 1.0;\n    output_variable","");
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,"[1][0] = 2.0;\n    output_variable","");
  plVar4 = local_108;
  local_118[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"[1][1] = 3.0;\n","");
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2f8,
             "layout(std140) uniform MyUniformBlock\n{\n    float f;\n    int   i;\n    uint  ui;\n} myUniformBlocks[2][2];\n\nvoid main()\n{\n"
             ,"");
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,"in  InBlock {\n    float input_variable;\n} in_block","");
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_298,
             "[2][2];\nout float output_variable;\n\nvoid main()\n{\n    output_variable = in_block"
             ,"");
  plVar5 = local_268;
  local_278[0] = plVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"[0][0].input_variable;\n","")
  ;
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"out OutBlock {\n    float output_variable;\n} out_block","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"[2][2];\n\nvoid main()\n{\n    out_block","");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,"[0][0].output_variable = 0.0;\n    out_block","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"[0][1].output_variable = 1.0;\n    out_block","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"[1][0].output_variable = 2.0;\n    out_block","");
  plVar2 = local_48;
  local_58[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"[1][1].output_variable = 3.0;\n","");
  local_320 = &local_310;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,local_2d8,local_2d0 + (long)local_2d8);
  if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x1e99);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  switch((ulong)tested_shader_type) {
  default:
    goto switchD_00b42dff_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&local_320);
    goto switchD_00b42dff_caseD_0;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar1 = &set_tesseation_abi_cxx11_;
  }
  std::__cxx11::string::_M_append((char *)&local_320,*puVar1);
switchD_00b42dff_caseD_0:
  std::__cxx11::string::_M_append((char *)&local_320,shader_end_abi_cxx11_);
  (*(local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[8])
            (local_300,CONCAT44(in_register_00000034,tested_shader_type),&local_320);
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT71(uStack_30f,local_310) + 1);
  }
  local_320 = &local_310;
  if (tested_shader_type != COMPUTE_SHADER_TYPE) {
    local_318 = 0;
    local_310 = 0;
    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_258[0]);
    if (tested_shader_type - GEOMETRY_SHADER_TYPE < 3) {
      std::__cxx11::string::append((char *)&local_320);
    }
    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_238[0]);
    if (tested_shader_type == TESSELATION_CONTROL_SHADER_TYPE) {
      std::__cxx11::string::append((char *)&local_320);
    }
    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_218[0]);
    if (tested_shader_type == TESSELATION_CONTROL_SHADER_TYPE) {
      std::__cxx11::string::append((char *)&local_320);
    }
    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_1f8[0]);
    if ((tested_shader_type == TESSELATION_EVALUATION_SHADER_TYPE) ||
       (tested_shader_type == GEOMETRY_SHADER_TYPE)) {
      std::__cxx11::string::append((char *)&local_320);
    }
    if (tested_shader_type == TESSELATION_CONTROL_SHADER_TYPE) {
      std::__cxx11::string::append((char *)&local_320);
    }
    std::__cxx11::string::_M_append((char *)&local_320,(ulong)local_1d8[0]);
    (*(code *)(&DAT_01ad37e8 + *(int *)(&DAT_01ad37e8 + (ulong)tested_shader_type * 4)))();
    return;
  }
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,local_2f8,local_2f0 + (long)local_2f8);
  std::__cxx11::string::_M_append((char *)&local_320,shader_end_abi_cxx11_);
  (*(local_300->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
    super_TestNode._vptr_TestNode[8])
            (local_300,CONCAT44(in_register_00000034,tested_shader_type),&local_320);
  if (local_320 != &local_310) {
    operator_delete(local_320,CONCAT71(uStack_30f,local_310) + 1);
  }
  lVar6 = -0xc0;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  lVar6 = -0x60;
  do {
    if (plVar5 != (long *)plVar5[-2]) {
      operator_delete((long *)plVar5[-2],*plVar5 + 1);
    }
    plVar5 = plVar5 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  lVar6 = -0xc0;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  lVar6 = -0xa0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0);
  if (local_2d8 != local_2c8) {
    operator_delete(local_2d8,local_2c8[0] + 1);
  }
  return;
}

Assistant:

void InteractionInterfaceArrays<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	/* Shader source with invalid buffer (buffer cannot be of arrays of arrays type). */
	const std::string invalid_buffer_shader_source = "layout(std140) buffer MyBuffer\n"
													 "{\n"
													 "    float f;\n"
													 "    int   i;\n"
													 "    uint  ui;\n"
													 "} myBuffers[2][2];\n\n"
													 "void main()\n"
													 "{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string invalid_input_shader_source[] = { "in  float input_variable", "[2][2];\n"
																					"out float output_variable",
														";\n\n"
														"void main()\n"
														"{\n"
														"    output_variable",
														" = input_variable", "[0][0];\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string invalid_output_shader_source[] = { "out float output_variable", "[2][2];\n\n"
																					  "void main()\n"
																					  "{\n"
																					  "    output_variable",
														 "[0][0] = 0.0;\n"
														 "    output_variable",
														 "[0][1] = 1.0;\n"
														 "    output_variable",
														 "[1][0] = 2.0;\n"
														 "    output_variable",
														 "[1][1] = 3.0;\n" };
	/* Shader source with invalid uniform block (uniform block cannot be of arrays of arrays type). */
	const std::string invalid_uniform_block_shader_source = "layout(std140) uniform MyUniformBlock\n"
															"{\n"
															"    float f;\n"
															"    int   i;\n"
															"    uint  ui;\n"
															"} myUniformBlocks[2][2];\n\n"
															"void main()\n"
															"{\n";
	/* Shader source with invalid input (input cannot be of arrays of arrays type). */
	const std::string input_block_shader_source[] = { "in  InBlock {\n"
													  "    float input_variable;\n"
													  "} in_block",

													  "[2][2];\n"
													  "out float output_variable;\n"
													  "\n"
													  "void main()\n"
													  "{\n"
													  "    output_variable = in_block",
													  "[0][0].input_variable;\n" };
	/* Shader source with invalid output (output cannot be of arrays of arrays type). */
	const std::string output_block_shader_source[] = { "out OutBlock {\n"
													   "    float output_variable;\n"
													   "} out_block",
													   "[2][2];\n"
													   "\n"
													   "void main()\n"
													   "{\n"
													   "    out_block",
													   "[0][0].output_variable = 0.0;\n"
													   "    out_block",
													   "[0][1].output_variable = 1.0;\n"
													   "    out_block",
													   "[1][0].output_variable = 2.0;\n"
													   "    out_block",
													   "[1][1].output_variable = 3.0;\n" };

	/* Verify that buffer arrays of arrays type is rejected. */
	{
		std::string source = invalid_buffer_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that INPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_input_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += invalid_input_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_input_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[3];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_input_shader_source[4];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that OUTPUTs arrays of arrays type is rejected. */
	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type)
	{
		std::string source;

		source += invalid_output_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += invalid_output_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += invalid_output_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verify that uniform block arrays of arrays type is rejected. */
	{
		std::string source = invalid_uniform_block_shader_source;

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS, tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of input blocks are accepted */
	if ((TestCaseBase<API>::VERTEX_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source += input_block_shader_source[0];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[]";
		}

		source += input_block_shader_source[1];

		if ((TestCaseBase<API>::GEOMETRY_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type) ||
			(TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE == tested_shader_type))
		{
			source += "[0]";
		}

		source += input_block_shader_source[2];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}

	/* Verifies if arrays of arrays of output blocks are accepted */
	if ((TestCaseBase<API>::FRAGMENT_SHADER_TYPE != tested_shader_type) &&
		(TestCaseBase<API>::COMPUTE_SHADER_TYPE != tested_shader_type))
	{
		std::string source;

		source = output_block_shader_source[0];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[]";
		}

		source += output_block_shader_source[1];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[2];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[3];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[4];

		if (TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE == tested_shader_type)
		{
			source += "[gl_InvocationID]";
		}

		source += output_block_shader_source[5];

		DEFAULT_MAIN_ENDING(tested_shader_type, source);

		EXECUTE_SHADER_TEST(API::ALLOW_A_OF_A_ON_INTERFACE_BLOCKS && API::ALLOW_IN_OUT_INTERFACE_BLOCKS,
							tested_shader_type, source);
	}
}